

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  undefined8 uVar5;
  stbrp_node **ppsVar6;
  stbrp_context *psVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  long extraout_RAX;
  long lVar12;
  int iVar13;
  undefined4 in_register_00000014;
  int iVar14;
  stbrp_node **ppsVar15;
  stbrp_node *psVar16;
  stbrp_node *psVar17;
  stbrp_node **in_R8;
  stbrp_node *psVar18;
  int iVar19;
  uint uVar20;
  stbrp_context *psVar21;
  ulong uVar22;
  stbrp_context *c;
  bool bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  int waste;
  int local_a8;
  uint local_a4;
  stbrp_node **local_a0;
  int local_90;
  int local_8c;
  stbrp_context *local_88;
  ulong local_80;
  undefined8 local_78;
  stbrp_node **local_70;
  stbrp_node *local_68;
  ulong local_60;
  stbrp_rect *local_58;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  stbrp_rect *local_38;
  
  local_78 = CONCAT44(in_register_00000014,num_rects);
  uVar22 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    uVar9 = (ulong)(num_rects + 0xfU & 0xfffffff0);
    auVar25 = vpbroadcastq_avx512f();
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar28 = vpmovsxbd_avx512f(_DAT_002964b0);
    auVar29 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar30 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      uVar11 = vpcmpuq_avx512f(auVar26,auVar25,2);
      uVar5 = vpcmpuq_avx512f(auVar27,auVar25,2);
      auVar31 = vpsllq_avx512f(auVar26,4);
      auVar32 = vpsllq_avx512f(auVar27,4);
      vpscatterqd_avx512f(ZEXT832(rects) + ZEXT832(0xc) + auVar32._0_32_,uVar5,auVar28._0_32_);
      auVar24 = vextracti64x4_avx512f(auVar28,1);
      vpscatterqd_avx512f(ZEXT832(rects) + ZEXT832(0xc) + auVar31._0_32_,uVar11,auVar24);
      auVar27 = vpaddq_avx512f(auVar27,auVar29);
      auVar26 = vpaddq_avx512f(auVar26,auVar29);
      auVar28 = vpaddd_avx512f(auVar28,auVar30);
      uVar9 = uVar9 - 0x10;
    } while (uVar9 != 0);
  }
  local_48 = (size_t)num_rects;
  qsort(rects,local_48,0x10,rect_height_compare);
  if (0 < num_rects) {
    ppsVar15 = &context->active_head;
    uVar9 = 0;
    local_88 = context;
    local_70 = ppsVar15;
    local_40 = uVar22;
    local_38 = rects;
    do {
      psVar1 = rects + uVar9;
      uVar2 = rects[uVar9].w;
      uVar10 = (ulong)uVar2;
      if (uVar2 == 0) {
LAB_0024aed1:
        psVar1->x = 0;
        psVar1->y = 0;
        local_a0 = in_R8;
      }
      else {
        uVar3 = psVar1->h;
        local_80 = (ulong)uVar3;
        if (uVar3 == 0) goto LAB_0024aed1;
        iVar13 = context->width;
        iVar19 = (uVar2 - 1) + context->align;
        iVar19 = iVar19 - iVar19 % context->align;
        local_60 = uVar10;
        local_58 = psVar1;
        local_50 = uVar9;
        if (iVar13 < iVar19) {
LAB_0024aec7:
          local_a0 = (stbrp_node **)0x0;
          uVar11 = 0;
        }
        else {
          iVar4 = context->height;
          local_80._0_4_ = (uint)uVar3;
          if (iVar4 < (int)(uint)local_80) goto LAB_0024aec7;
          c = (stbrp_context *)*ppsVar15;
          uVar2 = (ushort)c->width;
          psVar16 = (stbrp_node *)(ulong)uVar2;
          local_68 = psVar16;
          if (iVar13 < (int)(iVar19 + (uint)uVar2)) {
            local_a8 = 0x40000000;
            iVar14 = 0x40000000;
            local_a0 = (stbrp_node **)0x0;
          }
          else {
            iVar14 = 0x40000000;
            local_a0 = (stbrp_node **)0x0;
            local_a8 = 0x40000000;
            psVar21 = c;
            do {
              iVar8 = stbrp__skyline_find_min_y(psVar21,psVar16,iVar19,(int)&local_8c,(int *)in_R8);
              if (local_88->heuristic == 0) {
                if (iVar8 < iVar14) {
                  local_a0 = ppsVar15;
                  iVar14 = iVar8;
                }
              }
              else if (((int)local_80 + iVar8 <= iVar4) &&
                      ((iVar8 < iVar14 || ((iVar8 == iVar14 && (local_8c < local_a8)))))) {
                local_a8 = local_8c;
                local_a0 = ppsVar15;
                iVar14 = iVar8;
              }
              ppsVar15 = (stbrp_node **)&psVar21->align;
              uVar2 = (ushort)(*(stbrp_context **)&psVar21->align)->width;
              psVar16 = (stbrp_node *)(ulong)uVar2;
              psVar21 = *(stbrp_context **)&psVar21->align;
            } while ((int)(iVar19 + (uint)uVar2) <= iVar13);
          }
          if (local_a0 == (stbrp_node **)0x0) {
            local_a4 = 0;
          }
          else {
            local_a4 = (uint)(*local_a0)->x;
          }
          if (local_88->heuristic == 1) {
            uVar20 = (uint)local_68;
            psVar21 = c;
            while (ppsVar15 = local_70, (int)uVar20 < iVar19) {
              psVar21 = *(stbrp_context **)&psVar21->align;
              uVar20 = (uint)(ushort)psVar21->width;
            }
            do {
              uVar20 = (uint)(ushort)psVar21->width - iVar19;
              ppsVar6 = ppsVar15;
              psVar7 = c;
              do {
                c = psVar7;
                ppsVar15 = ppsVar6;
                ppsVar6 = (stbrp_node **)&c->align;
                psVar7 = *(stbrp_context **)&c->align;
              } while ((int)(uint)(ushort)(*(stbrp_context **)&c->align)->width <= (int)uVar20);
              iVar13 = stbrp__skyline_find_min_y
                                 (c,(stbrp_node *)(ulong)uVar20,iVar19,(int)&local_90,(int *)in_R8);
              if ((((int)local_80 + iVar13 <= iVar4) && (iVar13 <= iVar14)) &&
                 (((iVar13 < iVar14 || (local_90 < local_a8)) ||
                  ((local_90 == local_a8 && ((int)uVar20 < (int)local_a4)))))) {
                local_a8 = local_90;
                local_a4 = uVar20;
                local_a0 = ppsVar15;
                iVar14 = iVar13;
              }
              psVar21 = *(stbrp_context **)&psVar21->align;
            } while (psVar21 != (stbrp_context *)0x0);
          }
          uVar11 = CONCAT44(iVar14,local_a4);
          rects = local_38;
          ppsVar15 = local_70;
          context = local_88;
          uVar22 = local_40;
        }
        uVar9 = local_50;
        if (((local_a0 == (stbrp_node **)0x0) ||
            (iVar13 = (int)local_80 + (int)((ulong)uVar11 >> 0x20), context->height < iVar13)) ||
           (psVar16 = context->free_head, psVar16 == (stbrp_node *)0x0)) {
          local_58->x = 0xffff;
          local_58->y = 0xffff;
        }
        else {
          psVar16->x = (stbrp_coord)uVar11;
          psVar16->y = (stbrp_coord)iVar13;
          context->free_head = psVar16->next;
          psVar18 = *local_a0;
          iVar13 = (int)uVar11;
          psVar17 = psVar18;
          if ((int)(uint)psVar18->x < iVar13) {
            psVar17 = psVar18->next;
            local_a0 = &psVar18->next;
          }
          *local_a0 = psVar16;
          if (psVar17->next != (stbrp_node *)0x0) {
            local_a0 = &psVar17->next;
            psVar18 = psVar17->next;
            do {
              if (iVar13 + (int)local_60 < (int)(uint)psVar18->x) break;
              *local_a0 = context->free_head;
              context->free_head = psVar17;
              local_a0 = &psVar18->next;
              ppsVar6 = &psVar18->next;
              psVar17 = psVar18;
              psVar18 = *ppsVar6;
            } while (*ppsVar6 != (stbrp_node *)0x0);
          }
          psVar16->next = psVar17;
          iVar13 = (int)local_60 + iVar13;
          if ((int)(uint)psVar17->x < iVar13) {
            psVar17->x = (stbrp_coord)iVar13;
          }
          local_58->x = (stbrp_coord)uVar11;
          local_58->y = (stbrp_coord)((ulong)uVar11 >> 0x20);
        }
      }
      uVar9 = uVar9 + 1;
      in_R8 = local_a0;
    } while (uVar9 != uVar22);
  }
  qsort(rects,local_48,0x10,rect_original_order);
  lVar12 = extraout_RAX;
  if (0 < (int)local_78) {
    lVar12 = 0;
    do {
      bVar23 = true;
      if (*(short *)((long)&rects->x + lVar12) == -1) {
        bVar23 = *(short *)((long)&rects->y + lVar12) != -1;
      }
      *(uint *)((long)&rects->was_packed + lVar12) = (uint)bVar23;
      lVar12 = lVar12 + 0x10;
    } while (uVar22 * 0x10 != lVar12);
  }
  return (int)lVar12;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}